

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.c
# Opt level: O2

int ply_read_chunk(p_ply ply,void *anybuffer,size_t size)

{
  uint uVar1;
  size_t sVar2;
  ulong uVar3;
  
  uVar3 = 0;
  do {
    if (size <= uVar3) {
      return 1;
    }
    while (ply->buffer_last <= ply->buffer_first) {
      ply->buffer_first = 0;
      sVar2 = fread(ply->buffer,1,0x2000,(FILE *)ply->fp);
      ply->buffer_last = sVar2;
      uVar1 = (uint)(sVar2 != 0);
      if (sVar2 == 0) {
        return uVar1;
      }
      if (size <= uVar3) {
        return uVar1;
      }
    }
    *(char *)((long)anybuffer + uVar3) = ply->buffer[ply->buffer_first];
    ply->buffer_first = ply->buffer_first + 1;
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

static int ply_read_chunk(p_ply ply, void *anybuffer, size_t size) {
    char *buffer = (char *) anybuffer;
    size_t i = 0;
    assert(ply && ply->fp && ply->io_mode == PLY_READ);
    assert(ply->buffer_first <= ply->buffer_last);
    while (i < size) {
        if (ply->buffer_first < ply->buffer_last) {
            buffer[i] = ply->buffer[ply->buffer_first];
            ply->buffer_first++;
            i++;
        } else {
            ply->buffer_first = 0;
            ply->buffer_last = fread(ply->buffer, 1, BUFFERSIZE, ply->fp);
            if (ply->buffer_last <= 0) return 0;
        }
    }
    return 1;
}